

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O2

void ror_6A(void)

{
  except = '\0';
  result_f = (acc >> 1) + 0x80;
  if (carry_f == '\0') {
    result_f = acc >> 1;
  }
  carry_f = acc & 1;
  acc = result_f;
  return;
}

Assistant:

void ror_6A(void) {
    ubyte oldcar;

    CLE;
    oldcar = carry_f;


    carry_f = acc & 1;
    acc >>= 1;

    if (oldcar) acc |= 0x80;
    result_f = acc;
}